

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O3

void mtbdd_set_to_array(MTBDD set,uint32_t *arr)

{
  uint8_t *puVar1;
  long lVar2;
  
  puVar1 = nodes->data;
  do {
    lVar2 = (set & 0xffffffffff) * 0x10;
    *arr = (uint)((ulong)*(undefined8 *)(puVar1 + lVar2 + 8) >> 0x28);
    arr = arr + 1;
    set = set & 0x8000000000000000 ^ *(ulong *)(puVar1 + lVar2) & 0x800000ffffffffff;
  } while (set != 0x8000000000000000);
  return;
}

Assistant:

void
mtbdd_set_to_array(MTBDD set, uint32_t *arr)
{
    while (set != mtbdd_true) {
        mtbddnode_t n = MTBDD_GETNODE(set);
        *arr++ = mtbddnode_getvariable(n);
        set = node_gethigh(set, n);
    }
}